

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateStubDefinition
          (ServiceGenerator *this,Printer *printer)

{
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  ServiceGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->vars_);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "class $dllexport_decl $$classname$_Stub : public $classname$ {\n public:\n");
  io::Printer::Indent((Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "$classname$_Stub(::$proto_ns$::RpcChannel* channel);\n$classname$_Stub(::$proto_ns$::RpcChannel* channel,\n                 ::$proto_ns$::Service::ChannelOwnership ownership);\n~$classname$_Stub();\n\ninline ::$proto_ns$::RpcChannel* channel() { return channel_; }\n\n// implements $classname$ ------------------------------------------\n\n"
            );
  GenerateMethodSignatures
            (this,NON_VIRTUAL,
             (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  io::Printer::Outdent((Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Formatter::operator()<>
            ((Formatter *)local_50,
             " private:\n  ::$proto_ns$::RpcChannel* channel_;\n  bool owns_channel_;\n  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS($classname$_Stub);\n};\n\n"
            );
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void ServiceGenerator::GenerateStubDefinition(io::Printer* printer) {
  Formatter format(printer, vars_);
  format(
      "class $dllexport_decl $$classname$_Stub : public $classname$ {\n"
      " public:\n");

  printer->Indent();

  format(
      "$classname$_Stub(::$proto_ns$::RpcChannel* channel);\n"
      "$classname$_Stub(::$proto_ns$::RpcChannel* channel,\n"
      "                 ::$proto_ns$::Service::ChannelOwnership ownership);\n"
      "~$classname$_Stub();\n"
      "\n"
      "inline ::$proto_ns$::RpcChannel* channel() { return channel_; }\n"
      "\n"
      "// implements $classname$ ------------------------------------------\n"
      "\n");

  GenerateMethodSignatures(NON_VIRTUAL, printer);

  printer->Outdent();
  format(
      " private:\n"
      "  ::$proto_ns$::RpcChannel* channel_;\n"
      "  bool owns_channel_;\n"
      "  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS($classname$_Stub);\n"
      "};\n"
      "\n");
}